

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreqTable.cpp
# Opt level: O2

void __thiscall FreqTable::setTotal(FreqTable *this,double csum)

{
  double *pdVar1;
  
  if (csum == 0.0) {
    csum = 0.0;
    for (pdVar1 = (this->frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar1 != (this->frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish; pdVar1 = pdVar1 + 1) {
      csum = csum + *pdVar1;
    }
  }
  this->total = (int)csum;
  return;
}

Assistant:

void FreqTable::setTotal(double csum=0.0) {
    (static_cast<bool>(csum) ? this -> total = csum : this -> total = accumulate(frequencies.begin(), frequencies.end(), 0.0));
}